

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O3

void __thiscall SemanticTypes::visit(SemanticTypes *this,PointerValNode *pointerValNode)

{
  ExpNode *pEVar1;
  int iVar2;
  
  pEVar1 = pointerValNode->exp;
  if (pEVar1 == (ExpNode *)0x0) {
    visit((SemanticTypes *)pointerValNode);
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = pointerValNode->exp;
    if (pEVar1->pointer == false) {
      visit((SemanticTypes *)pointerValNode);
    }
    else {
      (pointerValNode->super_ExpNode).typeLexeme = pEVar1->typeLexeme;
      (pointerValNode->super_ExpNode).lValue = true;
      iVar2 = pEVar1->arraySize;
      (pointerValNode->super_ExpNode).type = pEVar1->type;
      (pointerValNode->super_ExpNode).arraySize = iVar2;
      (pointerValNode->super_ExpNode).pointer = false;
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(PointerValNode *pointerValNode) {

    if (pointerValNode->getExp()) {
        pointerValNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - pointerValNode] INVALID VALUE EXPRESSION, line %d\n",
                pointerValNode->getLine());
        return;
    }

    if (!pointerValNode->getExp()->isPointer()) {
        fprintf(stderr, "[SEMANTIC ERROR - pointerValNode] CANNOT ACCESS VALUE OF A NON POINTER TYPE, line %d\n",
                pointerValNode->getLine());
        return;
    }

    pointerValNode->setType(pointerValNode->getExp()->getType());
    pointerValNode->setTypeLexeme(pointerValNode->getExp()->getTypeLexeme());
    pointerValNode->setLValue(true);
    pointerValNode->setArraySize(pointerValNode->getExp()->getArraySize());
    pointerValNode->setPointer(false);

}